

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O1

void __thiscall JetHead::CircularBuffer::subtract_length_internal(CircularBuffer *this,uint size)

{
  undefined8 in_RAX;
  
  if (this->mLen < size) {
    jh_log_print(1,"void JetHead::CircularBuffer::subtract_length_internal(unsigned int)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/CircularBuffer.cpp"
                 ,0x232,"subtracting size: %d from mLen: %d would be negative",size,
                 CONCAT44((int)((ulong)in_RAX >> 0x20),this->mLen));
  }
  this->mLen = this->mLen - size;
  if (this->mWritePtr == this->mEnd) {
    this->mWritePtr = this->mBuffer;
  }
  return;
}

Assistant:

void CircularBuffer::subtract_length_internal( unsigned int size )
{
	if ( size > mLen )
	{
		LOG_ERR_FATAL("subtracting size: %d from mLen: %d would be negative",
					  size, mLen);
	}
	
	mLen -= size;

	// If we were in the full condition, update the write pointer to
	// its new beginning-of-buffer position.
	if (mWritePtr == mEnd)
	{
		mWritePtr = mBuffer;
	}
}